

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::GetTranspose(Matrix *__return_storage_ptr__,Matrix *this)

{
  int iVar1;
  Fraction *pFVar2;
  Fraction *pFVar3;
  int j;
  int iVar4;
  
  j = 0;
  Matrix(__return_storage_ptr__,this->m_,this->n_,0);
  iVar4 = this->m_;
  if (0 < iVar4) {
    iVar1 = this->n_;
    do {
      if (0 < iVar1) {
        iVar4 = 0;
        do {
          pFVar2 = At(this,iVar4,j);
          pFVar3 = At(__return_storage_ptr__,j,iVar4);
          *pFVar3 = *pFVar2;
          iVar4 = iVar4 + 1;
          iVar1 = this->n_;
        } while (iVar4 < iVar1);
        iVar4 = this->m_;
      }
      j = j + 1;
    } while (j < iVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::GetTranspose() const {
  Matrix result(m_, n_);
  for (int i = 0; i < m_; ++i) {
    for (int j = 0; j < n_; ++j) {
      result.At(i, j) = At(j, i);
    }
  }

  return result;
}